

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void releaseMemArray(Mem *p,int N)

{
  u8 uVar1;
  sqlite3 *db;
  Mem *pMVar2;
  
  if (N != 0 && p != (Mem *)0x0) {
    db = p->db;
    pMVar2 = p + N;
    if (db->pnBytesFreed == (int *)0x0) {
      uVar1 = db->mallocFailed;
      if (0 < N) {
        do {
          if ((p->flags & 0x2460) == 0) {
            if (p->zMalloc != (char *)0x0) {
              sqlite3DbFree(db,p->zMalloc);
              p->zMalloc = (char *)0x0;
            }
          }
          else {
            sqlite3VdbeMemRelease(p);
          }
          p->flags = 0x80;
          p = p + 1;
        } while (p < pMVar2);
      }
      db->mallocFailed = uVar1;
    }
    else if (0 < N) {
      do {
        sqlite3DbFree(db,p->zMalloc);
        p = p + 1;
      } while (p < pMVar2);
    }
  }
  return;
}

Assistant:

static void releaseMemArray(Mem *p, int N){
  if( p && N ){
    Mem *pEnd;
    sqlite3 *db = p->db;
    u8 malloc_failed = db->mallocFailed;
    if( db->pnBytesFreed ){
      for(pEnd=&p[N]; p<pEnd; p++){
        sqlite3DbFree(db, p->zMalloc);
      }
      return;
    }
    for(pEnd=&p[N]; p<pEnd; p++){
      assert( (&p[1])==pEnd || p[0].db==p[1].db );

      /* This block is really an inlined version of sqlite3VdbeMemRelease()
      ** that takes advantage of the fact that the memory cell value is 
      ** being set to NULL after releasing any dynamic resources.
      **
      ** The justification for duplicating code is that according to 
      ** callgrind, this causes a certain test case to hit the CPU 4.7 
      ** percent less (x86 linux, gcc version 4.1.2, -O6) than if 
      ** sqlite3MemRelease() were called from here. With -O2, this jumps
      ** to 6.6 percent. The test case is inserting 1000 rows into a table 
      ** with no indexes using a single prepared INSERT statement, bind() 
      ** and reset(). Inserts are grouped into a transaction.
      */
      if( p->flags&(MEM_Agg|MEM_Dyn|MEM_Frame|MEM_RowSet) ){
        sqlite3VdbeMemRelease(p);
      }else if( p->zMalloc ){
        sqlite3DbFree(db, p->zMalloc);
        p->zMalloc = 0;
      }

      p->flags = MEM_Invalid;
    }
    db->mallocFailed = malloc_failed;
  }
}